

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionError.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::PositionError::Decode(PositionError *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (3 < KVar1) {
    (*(this->m_HorzErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_HorzErr,stream);
    (*(this->m_VertErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_VertErr,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void PositionError::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < POSITION_ERROR_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_HorzErr
           >> KDIS_STREAM m_VertErr;
}